

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O3

int GetDefaultLocaleMask(TCascStorage *hs,PQUERY_KEY pTagsString)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long in_RDX;
  TGameLocaleString *pTVar5;
  PQUERY_KEY p_Var6;
  DWORD DVar7;
  PQUERY_KEY p_Var8;
  
  if (in_RDX < 1) {
    DVar7 = 0;
  }
  else {
    p_Var8 = (PQUERY_KEY)((long)&pTagsString->pbData + in_RDX);
    DVar7 = 0;
    do {
      p_Var6 = (PQUERY_KEY)((long)&pTagsString->pbData + 4);
      if ((p_Var8 < p_Var6) ||
         ((*(char *)&p_Var6->pbData != ',' && (*(char *)&p_Var6->pbData != ' ')))) {
        p_Var6 = (PQUERY_KEY)((long)&pTagsString->pbData + 1);
      }
      else {
        iVar2 = strncmp("enUS",(char *)pTagsString,4);
        pTVar5 = LocaleStrings;
        if (iVar2 != 0) {
          lVar1 = 0;
          do {
            lVar4 = lVar1;
            if (lVar4 + 0x10 == 0xf0) {
              uVar3 = 0;
              goto LAB_00112037;
            }
            iVar2 = strncmp(*(char **)((long)&LocaleStrings[1].szLocale + lVar4),(char *)pTagsString
                            ,4);
            lVar1 = lVar4 + 0x10;
          } while (iVar2 != 0);
          pTVar5 = (TGameLocaleString *)(lVar4 + 0x12d360);
        }
        uVar3 = pTVar5->dwLocale;
LAB_00112037:
        DVar7 = DVar7 | uVar3;
      }
      pTagsString = p_Var6;
    } while (p_Var6 < p_Var8);
  }
  hs->dwDefaultLocale = DVar7;
  return (int)hs;
}

Assistant:

static int GetDefaultLocaleMask(TCascStorage * hs, PQUERY_KEY pTagsString)
{
    char * szTagEnd = (char *)pTagsString->pbData + pTagsString->cbData;
    char * szTagPtr = (char *)pTagsString->pbData;
    DWORD dwLocaleMask = 0;

    while(szTagPtr < szTagEnd)
    {
        // Could this be a locale string?
        if((szTagPtr + 4) <= szTagEnd && (szTagPtr[4] == ',' ||  szTagPtr[4] == ' '))
        {
            // Check whether the current tag is a language identifier
            dwLocaleMask = dwLocaleMask | GetLocaleMask(szTagPtr);
            szTagPtr += 4;
        }
        else
        {
            szTagPtr++;
        }
    }

    hs->dwDefaultLocale = dwLocaleMask;
    return ERROR_SUCCESS;
}